

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.h
# Opt level: O2

void image_32_filter_75_case(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  integral_image *iimage_00;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined8 uStack_100;
  long local_f8;
  ulong local_f0;
  ulong local_e8;
  integral_image *local_e0;
  float *local_d8;
  bool *local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  int local_80;
  int local_7c;
  int local_78;
  float local_74;
  long local_70;
  ulong local_68;
  int local_5c;
  int local_58;
  int local_54;
  long local_50;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  int local_34;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  iVar8 = layer->filter_size;
  uVar7 = iimage->width;
  pfVar2 = iimage->data;
  iVar1 = layer->step;
  local_50 = (long)iVar1;
  local_34 = layer->height;
  uStack_100 = 3;
  iVar10 = (iimage->height + -1) * iimage->data_width;
  local_e0 = iimage;
  local_d8 = layer->response;
  local_d0 = layer->laplacian;
  lVar4 = -((ulong)uVar7 * 4 + 0xf & 0xfffffffffffffff0);
  local_70 = (long)&local_f8 + lVar4;
  local_a0 = layer->width * local_50;
  iVar13 = (int)((long)iVar8 / 3);
  iVar9 = iVar10 - iVar13;
  local_68 = (long)iVar8 / 3 & 0xffffffff;
  iVar12 = iVar13 + -1 + iVar10;
  for (lVar11 = 0; lVar11 < (int)local_a0 - iVar13; lVar11 = lVar11 + local_50) {
    *(float *)((long)&local_f8 + lVar4 + lVar11 * 4) = pfVar2[iVar12];
    iVar9 = iVar9 + iVar1;
    iVar12 = iVar12 + iVar1;
  }
  *(undefined8 *)((long)&uStack_100 + lVar4) = 2;
  local_88 = (long)(iVar8 + -1) / (long)(int)*(undefined8 *)((long)&uStack_100 + lVar4) & 0xffffffff
  ;
  fVar15 = pfVar2[(int)((uVar7 - 1) + iVar10)];
  for (; lVar11 < (int)local_68; lVar11 = lVar11 + local_50) {
    *(float *)(local_70 + lVar11 * 4) = fVar15;
    iVar9 = iVar9 + (int)local_50;
  }
  for (; lVar11 < local_a0; lVar11 = lVar11 + local_50) {
    *(float *)(local_70 + lVar11 * 4) = fVar15 - pfVar2[iVar9];
    iVar9 = iVar9 + (int)local_50;
  }
  local_34 = local_34 * (int)local_50;
  local_74 = 1.0 / (float)(iVar8 * iVar8);
  *(undefined8 *)((long)&uStack_100 + lVar4) = 6;
  iimage_00 = local_e0;
  local_f8 = 0;
  local_c8 = (ulong)~(uint)local_88;
  uVar6 = ~(iVar8 / (int)*(undefined8 *)((long)&uStack_100 + lVar4));
  local_90 = (ulong)uVar6;
  uVar7 = (uint)local_68;
  local_c0 = (ulong)(uVar7 - 2);
  local_b0 = (ulong)(uVar6 + uVar7);
  local_b8 = (ulong)~uVar7;
  local_a8 = (ulong)-uVar7;
  for (local_98 = 0; iVar8 = (int)local_98, iVar8 < local_34;
      local_98 = (ulong)(uint)((int)local_98 + (int)local_50)) {
    local_f8 = (long)(int)local_f8;
    local_78 = (int)local_68;
    local_f0 = (ulong)(uint)(iVar8 - local_78);
    local_5c = iVar8 + local_78;
    local_54 = (iVar8 - local_78) - 1;
    local_7c = iVar8 + -1 + local_78;
    local_58 = iVar8 + -1;
    uVar7 = (int)local_90 + iVar8;
    local_e8 = (ulong)uVar7;
    local_78 = local_78 + uVar7;
    for (lVar11 = 0; iVar8 = local_78, uVar5 = local_e8, lVar11 < local_a0;
        lVar11 = lVar11 + local_50) {
      iVar1 = (int)lVar11;
      local_40 = (float)(iVar1 + -1);
      iVar9 = (int)local_a8;
      iVar13 = (int)local_68 + iVar1;
      iVar10 = (int)local_c0;
      local_44 = *(float *)(local_70 + lVar11 * 4);
      local_80 = iVar13;
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x154e0d;
      auVar16._0_4_ =
           box_integral_unconditional_opt(iimage_00,(int)uVar5,iVar9 + iVar1,iVar8,iVar10 + iVar1);
      iVar10 = local_7c;
      auVar16._4_60_ = extraout_var;
      auVar3 = vfmadd213ss_fma(auVar16._0_16_,SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)local_44)
                              );
      iVar8 = (int)local_c8;
      iVar12 = (int)local_f0;
      iVar9 = (int)local_88;
      local_44 = auVar3._0_4_;
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x154e50;
      local_3c = box_integral_unconditional_opt(iimage_00,iVar12,iVar8 + iVar1,iVar10,iVar9 + iVar1)
      ;
      iVar8 = (int)local_90;
      iVar9 = (int)local_b0;
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x154e79;
      auVar17._0_4_ =
           box_integral_unconditional_opt(iimage_00,iVar12,iVar8 + iVar1,iVar10,iVar9 + iVar1);
      iVar9 = local_54;
      iVar8 = local_58;
      auVar17._4_60_ = extraout_var_00;
      auVar3 = vfmadd132ss_fma(auVar17._0_16_,ZEXT416((uint)local_3c),ZEXT416(0xc0400000));
      local_3c = auVar3._0_4_;
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x154ea0;
      local_38 = box_integral_unconditional_opt(iimage_00,iVar9,iVar1,iVar8,iVar13);
      fVar15 = local_40;
      iVar8 = local_5c;
      iVar13 = (int)local_b8 + iVar1;
      iVar10 = (int)local_98;
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x154ecf;
      fVar14 = box_integral_unconditional_opt(iimage_00,iVar10,iVar13,iVar8,(int)fVar15);
      iVar9 = local_54;
      iVar8 = local_58;
      local_38 = fVar14 + local_38;
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x154eed;
      local_40 = box_integral_unconditional_opt(iimage_00,iVar9,iVar13,iVar8,(int)fVar15);
      iVar9 = local_5c;
      iVar8 = local_80;
      local_40 = local_38 - local_40;
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x154f10;
      fVar15 = box_integral_unconditional_opt(iimage_00,iVar10,iVar1,iVar9,iVar8);
      fVar15 = local_74 * (local_40 - fVar15);
      auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15 * -0.81)),
                               ZEXT416((uint)(local_74 * local_3c)),
                               ZEXT416((uint)(local_74 * local_44)));
      local_d8[local_f8] = auVar3._0_4_;
      local_d0[local_f8] = 0.0 <= local_74 * local_44 + local_74 * local_3c;
      local_f8 = local_f8 + 1;
    }
  }
  return;
}

Assistant:

inline void image_32_filter_75_case(struct response_layer *layer, struct integral_image *iimage) {
    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    /* 2.2.b Half the filter is longer than the image, but narrower.
    // HERE: width > lobe and height <= border
    // Here only the whole filter is optimized, not negative part

    // Only happens for filter: 75 and image: 32

    // A, B = 0
    // D is outside (i.e. below) the image, but the columns change.
    // => D = [height-1, some_column]
    // C = 0 or [height-1, some_column]
    */

    // Create array for Dyy that has image width length
    // all rows (for big part) have same Dyy values
    float Dyy_arr[iwidth];  // stack is faster than heap

    // C = 0 and D = [height-1, some_column]
    // from y = 0 until D is (exclusive) in last column
    for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
        // C = 0
        // D = [height-1, i+lobe-1]
        D = data[(iheight-1) * data_width + (i+lobe-1)];
        Dyy_arr[i] = D;
    }

    // only bottom left corner value needed
    D = data[(iheight-1) * data_width + (iwidth-1)];

    // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
    // C is still outside and D now too
    for (; i < lobe; i += step) {  // 7 - 25
        Dyy_arr[i] = D;
    }

    // if y = lobe, then C = [height-1, 0]
    // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
    for (; i < width*step; i += step) {  // 25 - 32
        // C = [height-1, i-lobe]
        // D = [height-1, width-1]
        C = data[(iheight-1) * data_width + (i-lobe)];
        Dyy_arr[i] = D - C;
    }

    // Use precomputation for faster compute
    for (x = 0; x < height * step; x += step) {

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;
        t9 = x - lobe / 2 - 1;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = Dyy_arr[y] - 3 * box_integral_unconditional_opt(iimage, t9, t6 + 1, t9 + lobe , t8 - 2);

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dyy *= inv_area;
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;

            // Increment index
            ind += 1;
        }
    }
}